

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O3

unsigned_long __thiscall
Assimp::StreamReader<true,_true>::Get<unsigned_long>(StreamReader<true,_true> *this)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  runtime_error *this_00;
  uint uVar4;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar11;
  uint uVar12;
  uint uVar14;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  ulong uVar5;
  ulong uVar10;
  ulong uVar13;
  ulong uVar15;
  
  puVar1 = (ulong *)((long)this->current + 8);
  if (this->limit < puVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"End of file or stream limit was reached","");
    std::runtime_error::runtime_error(this_00,(string *)local_50);
    *(undefined ***)this_00 = &PTR__runtime_error_007da4b8;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = *(ulong *)this->current;
  uVar13 = uVar3 >> 8;
  uVar12 = (uint)(uVar3 >> 8);
  uVar15 = uVar3 >> 0x10;
  uVar14 = (uint)(uVar3 >> 0x10);
  uVar10 = uVar3 >> 0x18;
  uVar9 = (uint)(uVar3 >> 0x18);
  uVar5 = uVar3 >> 0x20;
  uVar4 = (uint)(uVar3 >> 0x20);
  uVar7 = uVar3 >> 0x28;
  uVar6 = uVar3 >> 0x30;
  uVar2 = uVar3 >> 0x30;
  uVar8 = uVar3 >> 0x38;
  if (this->le == false) {
    uVar11 = uVar3 & 0xff;
    uVar3 = uVar8;
    uVar6 = uVar13;
    uVar5 = uVar10;
    uVar7 = uVar15;
    uVar8 = uVar11;
    uVar9 = uVar4;
    uVar14 = uVar4 >> 8;
    uVar12 = (uint)(ushort)uVar2;
  }
  this->current = (int8_t *)puVar1;
  return uVar3 & 0xff |
         (ulong)((uVar12 & 0xff) << 8) |
         (ulong)((uVar14 & 0xff) << 0x10) |
         (ulong)(uVar9 << 0x18) |
         (uVar5 & 0xff) << 0x20 | (uVar7 & 0xff) << 0x28 | (uVar6 & 0xff) << 0x30 | uVar8 << 0x38;
}

Assistant:

T Get() {
        if ( current + sizeof(T) > limit) {
            throw DeadlyImportError("End of file or stream limit was reached");
        }

        T f;
        ::memcpy (&f, current, sizeof(T));
        Intern::Getter<SwapEndianess,T,RuntimeSwitch>() (&f,le);
        current += sizeof(T);

        return f;
    }